

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

void __thiscall lsim::ModelCircuit::disconnect_component(ModelCircuit *this,uint32_t id)

{
  bool bVar1;
  reference ppVar2;
  pointer this_00;
  pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  wire_lut_t *__range1;
  uint32_t id_local;
  ModelCircuit *this_local;
  
  __end1 = std::
           unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
           ::begin(&this->m_wires);
  pair = (pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
          *)std::
            unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
            ::end(&this->m_wires);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                         *)&pair);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
             ::operator*(&__end1);
    this_00 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::operator->
                        (&ppVar2->second);
    ModelWire::remove_component_pins(this_00,id);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ModelCircuit::disconnect_component(uint32_t id) {
    for (auto &pair : m_wires) {
        pair.second->remove_component_pins(id);
    }
}